

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>::
emplaceRealloc<slang::ast::CheckerInstanceBodySymbol&,slang::ast::Symbol_const&,slang::syntax::ExpressionSyntax_const*&,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>&>
          (SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection> *this,pointer pos,
          CheckerInstanceBodySymbol *args,Symbol *args_1,ExpressionSyntax **args_2,
          span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *args_3)

{
  size_type sVar1;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes;
  size_type sVar2;
  size_type sVar3;
  iterator pCVar4;
  long lVar5;
  pointer pCVar6;
  iterator pCVar7;
  iterator in_RSI;
  __extent_storage<18446744073709551615UL> in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  ExpressionSyntax *in_stack_ffffffffffffff68;
  Connection *in_stack_ffffffffffffff70;
  CheckerInstanceBodySymbol *in_stack_ffffffffffffff78;
  size_type in_stack_ffffffffffffff80;
  iterator this_00;
  SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection> *in_stack_ffffffffffffff88;
  
  sVar1 = ((SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection> *)in_RDI._M_extent_value)
          ->len;
  sVar2 = max_size((SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection> *)0x6338b9);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = calculateGrowth(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  this_00 = in_RSI;
  pCVar4 = begin((SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection> *)
                 in_RDI._M_extent_value);
  lVar5 = (long)this_00 - (long)pCVar4;
  pCVar6 = (pointer)operator_new(0x63391e);
  attributes._M_extent._M_extent_value = in_RDI._M_extent_value;
  attributes._M_ptr = (pointer)in_stack_ffffffffffffff88;
  slang::ast::CheckerInstanceSymbol::Connection::Connection
            (this_00,in_stack_ffffffffffffff78,(Symbol *)in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68,attributes);
  pCVar4 = in_RSI;
  pCVar7 = end((SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection> *)
               in_RDI._M_extent_value);
  if (pCVar4 == pCVar7) {
    pCVar7 = begin((SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection> *)
                   in_RDI._M_extent_value);
    pCVar4 = end((SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection> *)
                 in_RDI._M_extent_value);
    std::
    uninitialized_move<slang::ast::CheckerInstanceSymbol::Connection*,slang::ast::CheckerInstanceSymbol::Connection*>
              (this_00,pCVar7,in_stack_ffffffffffffff70);
  }
  else {
    begin((SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection> *)in_RDI._M_extent_value);
    std::
    uninitialized_move<slang::ast::CheckerInstanceSymbol::Connection*,slang::ast::CheckerInstanceSymbol::Connection*>
              (this_00,(Connection *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    pCVar4 = end((SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection> *)
                 in_RDI._M_extent_value);
    std::
    uninitialized_move<slang::ast::CheckerInstanceSymbol::Connection*,slang::ast::CheckerInstanceSymbol::Connection*>
              (this_00,(Connection *)in_stack_ffffffffffffff78,in_RSI);
  }
  cleanup((SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection> *)in_RDI._M_extent_value,
          (EVP_PKEY_CTX *)pCVar4);
  ((SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection> *)in_RDI._M_extent_value)->len =
       ((SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection> *)in_RDI._M_extent_value)->
       len + 1;
  ((SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection> *)in_RDI._M_extent_value)->cap =
       sVar3;
  ((SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection> *)in_RDI._M_extent_value)->data_
       = pCVar6;
  return pCVar6 + lVar5 / 0x48;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}